

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void load_rooms(FILE *fp)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  ROOM_INDEX_DATA *pRVar7;
  char *pcVar8;
  EXIT_DATA *pEVar9;
  size_t sVar10;
  TRAP_DATA *pTVar11;
  EXTRA_DESCR_DATA *pEVar12;
  long lVar13;
  double dVar14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  short vnum;
  char local_1241;
  long *local_1240;
  char error_v [4608];
  
  if (area_last == (AREA_DATA_conflict *)0x0) {
    bugout("Load_resets: no #AREA seen yet.");
  }
LAB_00142fdb:
  vnum = 0;
  local_1241 = fread_letter(fp);
  if (local_1241 != '#') {
    fmt_00._M_str = "Letter is {}.";
    fmt_00._M_len = 0xd;
    CLogger::Error<char&>((CLogger *)&wear_locations,fmt_00,&local_1241);
    fmt_01._M_str = "Load_newrooms: # not found, last vnum {}.";
    fmt_01._M_len = 0x29;
    CLogger::Error<short&>((CLogger *)&wear_locations,fmt_01,&vnum);
    exit(0);
  }
  iVar5 = fread_number(fp);
  vnum = (short)iVar5;
  if (vnum == 0) {
    return;
  }
  fBootDb = false;
  pRVar7 = get_room_index((int)vnum);
  if (pRVar7 != (ROOM_INDEX_DATA *)0x0) {
    sprintf(error_v,"Load_rooms: vnum %d duplicated.",(ulong)(uint)(int)vnum);
    bugout(error_v);
  }
  fBootDb = true;
  pRVar7 = (ROOM_INDEX_DATA *)operator_new(0x1c0);
  pRVar7->reset_first = (RESET_DATA *)0x0;
  pRVar7->reset_last = (RESET_DATA *)0x0;
  pcVar8 = (char *)palloc_string("");
  pRVar7->owner = pcVar8;
  pRVar7->move_progs = false;
  pRVar7->alt_description = (char *)0x0;
  pRVar7->alt_description_cond = 0;
  pRVar7->alt_name = (char *)0x0;
  pRVar7->trap = (TRAP_DATA *)0x0;
  pRVar7->affected = (ROOM_AFFECT_DATA *)0x0;
  local_1240 = pRVar7->room_flags;
  pRVar7->people = (CHAR_DATA *)0x0;
  pRVar7->contents = (OBJ_DATA *)0x0;
  pRVar7->extra_descr = (EXTRA_DESCR_DATA *)0x0;
  zero_vector(local_1240);
  for (lVar13 = 0xd; lVar13 != 0x11; lVar13 = lVar13 + 1) {
    pEVar9 = (EXIT_DATA *)new_track_data();
    pRVar7->exit[lVar13 + -7] = pEVar9;
  }
  pRVar7->area = area_last;
  pRVar7->vnum = vnum;
  pcVar8 = fread_string(fp);
  pRVar7->name = pcVar8;
  sVar10 = strlen(pcVar8);
  if (pcVar8[sVar10 - 1] == '.') {
    chop(pcVar8);
  }
  pcVar8 = fread_string(fp);
  pRVar7->description = pcVar8;
  fread_word(fp);
  iVar5 = sect_lookup(fread_word::word);
  pRVar7->sector_type = *(short *)(std::ofstream::~ofstream + (long)iVar5 * 0x18);
  pRVar7->rprogs = (RPROG_DATA *)0x0;
  zero_vector(pRVar7->progtypes);
  pRVar7->cabal = 0;
  pRVar7->has_rune = false;
  zero_vector(pRVar7->affected_by);
  if (pRVar7->area->area_type == 6) {
    *(byte *)((long)local_1240 + 2) = *(byte *)((long)local_1240 + 2) | 0xd0;
  }
  for (lVar13 = 7; lVar13 != 0xd; lVar13 = lVar13 + 1) {
    pRVar7->exit[lVar13 + -7] = (EXIT_DATA *)0x0;
  }
  pRVar7->heal_rate = 100;
  pRVar7->mana_rate = 100;
  pRVar7->light = 0;
  do {
    cVar1 = fread_letter(fp);
    cVar2 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar2 = cVar1;
    }
    switch(cVar2) {
    case 'A':
      fread_word(fp);
      iVar5 = fread_number(fp);
      pRVar7->alt_description_cond = (short)iVar5;
      pcVar8 = fread_string(fp);
      pRVar7->alt_name = pcVar8;
      pcVar8 = fread_string(fp);
      pRVar7->alt_description = pcVar8;
      break;
    default:
      ungetc((int)cVar2,(FILE *)fp);
      goto switchD_001431f1_caseD_53;
    case 'C':
      fread_word(fp);
      if (pRVar7->cabal != 0) {
        bugout("Load_rooms: duplicate cabal fields.");
      }
      fread_word(fp);
      sVar4 = cabal_lookup(fread_word::word);
      pRVar7->cabal = sVar4;
      break;
    case 'D':
      fread_word(fp);
      uVar6 = flag_lookup(fread_word::word,(flag_type *)&direction_table);
      if (5 < uVar6) {
        fmt._M_str = "Fread_rooms: vnum {} has bad door number.";
        fmt._M_len = 0x29;
        CLogger::Error<short&>((CLogger *)&wear_locations,fmt,&vnum);
        exit(1);
      }
      pEVar9 = (EXIT_DATA *)operator_new(0x50);
      iVar5 = fread_number(fp);
      (pEVar9->u1).vnum = (short)iVar5;
      fread_flag_new(pEVar9->exit_info,fp);
      iVar5 = fread_number(fp);
      pEVar9->key = (short)iVar5;
      pcVar8 = fread_string(fp);
      pEVar9->keyword = pcVar8;
      pcVar8 = fread_string(fp);
      pEVar9->description = pcVar8;
      pRVar7->exit[uVar6] = pEVar9;
      top_exit = top_exit + 1;
      break;
    case 'E':
      pEVar12 = (EXTRA_DESCR_DATA *)operator_new(0x20);
      pcVar8 = fread_string(fp);
      pEVar12->keyword = pcVar8;
      pcVar8 = fread_string(fp);
      pEVar12->description = pcVar8;
      pEVar12->next = pRVar7->extra_descr;
      pRVar7->extra_descr = pEVar12;
      top_ed = top_ed + 1;
      break;
    case 'G':
      iVar5 = fread_number(fp);
      pRVar7->guild = (short)iVar5;
      break;
    case 'H':
      iVar5 = fread_number(fp);
      pRVar7->heal_rate = (short)iVar5;
      break;
    case 'M':
      iVar5 = fread_number(fp);
      pRVar7->mana_rate = (short)iVar5;
      break;
    case 'O':
      fread_word(fp);
      if (*pRVar7->owner != '\0') {
        bugout("Load_rooms: duplicate owner.");
      }
      pcVar8 = fread_string(fp);
      pRVar7->owner = pcVar8;
      break;
    case 'R':
      fread_word(fp);
      fread_word(fp);
      iVar5 = flag_lookup(fread_word::word,(flag_type *)&room_flags);
      if ((iVar5 == -99) && (bVar3 = str_cmp(fread_word::word,"dark"), bVar3)) {
        bugout("Invalid bitvector specified for room flags.");
      }
      dVar14 = ldexp(1.0,iVar5 % 0x20);
      local_1240[iVar5 / 0x20] = local_1240[iVar5 / 0x20] | (long)dVar14;
      break;
    case 'S':
      goto switchD_001431f1_caseD_53;
    case 'T':
      fread_word(fp);
      pTVar11 = (TRAP_DATA *)new_trap();
      pTVar11->room = pRVar7;
      fread_word(fp);
      iVar5 = flag_lookup(fread_word::word,(flag_type *)&trap_table);
      pTVar11->type = iVar5;
      iVar5 = fread_number(fp);
      if (9 < iVar5) {
        iVar5 = 10;
      }
      pTVar11->quality = iVar5;
      iVar5 = fread_number(fp);
      pTVar11->complexity = iVar5;
      iVar5 = fread_number(fp);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      pTVar11->timer = iVar5;
      pcVar8 = fread_string(fp);
      pTVar11->trig_echo = pcVar8;
      pcVar8 = fread_string(fp);
      pTVar11->exec_echo = pcVar8;
      pTVar11->armed = true;
      pRVar7->trap = pTVar11;
    }
  } while( true );
switchD_001431f1_caseD_53:
  pRVar7->next = room_index_hash[vnum % 0x400];
  room_index_hash[vnum % 0x400] = pRVar7;
  pRVar7->next_room = room_list;
  top_room = top_room + 1;
  room_list = pRVar7;
  goto LAB_00142fdb;
}

Assistant:

void load_rooms(FILE *fp)
{
	ROOM_INDEX_DATA *pRoomIndex;
	char error_v[MAX_STRING_LENGTH];
	int i;

	if (area_last == nullptr)
		bugout("Load_resets: no #AREA seen yet.");

	for (;;)
	{
		short vnum = 0;
		char letter;
		char *bword;
		long bitvect;
		int door;
		int iHash;

		letter = fread_letter(fp);
		if (letter != '#')
		{
			RS.Logger.Error("Letter is {}.", letter);
			RS.Logger.Error("Load_newrooms: # not found, last vnum {}.", vnum);
			exit(0);
		}

		vnum = fread_number(fp);
		if (vnum == 0)
			break;

		fBootDb= false;

		if (get_room_index(vnum) != nullptr)
		{
			sprintf(error_v, "Load_rooms: vnum %d duplicated.", vnum);
			bugout(error_v);
		}

		fBootDb = true;

		pRoomIndex = new ROOM_INDEX_DATA;
		pRoomIndex->reset_first = nullptr;
		pRoomIndex->reset_last = nullptr;
		pRoomIndex->owner = palloc_string("");
		pRoomIndex->move_progs= false;
		pRoomIndex->people = nullptr;
		pRoomIndex->contents = nullptr;
		pRoomIndex->extra_descr = nullptr;
		pRoomIndex->alt_description = nullptr;
		pRoomIndex->alt_description_cond = 0;
		pRoomIndex->alt_name = nullptr;
		pRoomIndex->trap = nullptr;
		pRoomIndex->affected = nullptr;
		zero_vector(pRoomIndex->room_flags);

		for (i = 0; i < MAX_TRACKS; i++)
		{
			pRoomIndex->tracks[i] = new_track_data();
		}

		pRoomIndex->area = area_last;
		pRoomIndex->vnum = vnum;
		pRoomIndex->name = fread_string(fp);

		if (pRoomIndex->name[strlen(pRoomIndex->name) - 1] == '.')
			chop(pRoomIndex->name);

		pRoomIndex->description = fread_string(fp);
		pRoomIndex->sector_type = sect_table[sect_lookup(fread_word(fp))].value;

		/* Morg - Valgrind fix. */
		pRoomIndex->rprogs = nullptr;
		zero_vector(pRoomIndex->progtypes);
		pRoomIndex->cabal = 0;
		pRoomIndex->has_rune= false;

		zero_vector(pRoomIndex->affected_by);
		if (pRoomIndex->area->area_type == ARE_SHRINE)
		{
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_TO);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_FROM);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_GATE);
		}

		auto pRoomIndex_exit_size = std::size(pRoomIndex->exit);
		for (door = 0; door < pRoomIndex_exit_size; door++)
		{
			pRoomIndex->exit[door] = nullptr;
		}

		/* defaults */
		pRoomIndex->heal_rate = 100;
		pRoomIndex->mana_rate = 100;
		pRoomIndex->light = 0;

		for (;;)
		{
			letter = fread_letter(fp);
			letter = UPPER(letter);
			if (letter == 'S')
				break;

			if (letter == 'H') /* healing room */
				pRoomIndex->heal_rate = fread_number(fp);
			else if (letter == 'M') /* mana room */
				pRoomIndex->mana_rate = fread_number(fp);
			else if (letter == 'G') /* Guilds...added by Ceran */
				pRoomIndex->guild = fread_number(fp);
			else if (letter == 'A') // ALTDESC
			{
				fread_word(fp);
				pRoomIndex->alt_description_cond = fread_number(fp);
				pRoomIndex->alt_name = fread_string(fp);
				pRoomIndex->alt_description = fread_string(fp);
			}
			else if (letter == 'C') /* Cabal */
			{
				fread_word(fp);
				if (pRoomIndex->cabal)
					bugout("Load_rooms: duplicate cabal fields.");
				pRoomIndex->cabal = cabal_lookup(fread_word(fp));
			}
			else if (letter == 'D')
			{
				EXIT_DATA *pexit;

				door = flag_lookup(fread_word(fp), direction_table);
				if (door < 0 || door > 5)
				{
					RS.Logger.Error("Fread_rooms: vnum {} has bad door number.", vnum);
					exit(1);
				}

				pexit = new EXIT_DATA;
				pexit->u1.vnum = fread_number(fp);
				fread_flag_new(pexit->exit_info, fp);
				pexit->key = fread_number(fp);
				pexit->keyword = fread_string(fp);
				pexit->description = fread_string(fp);

				pRoomIndex->exit[door] = pexit;
				top_exit++;
			}
			else if (letter == 'E')
			{
				EXTRA_DESCR_DATA *ed;

				ed = new EXTRA_DESCR_DATA;
				ed->keyword = fread_string(fp);
				ed->description = fread_string(fp);
				ed->next = pRoomIndex->extra_descr;
				pRoomIndex->extra_descr = ed;
				top_ed++;
			}
			else if (letter == 'T')
			{
				TRAP_DATA *trap;
				fread_word(fp);

				trap = new_trap();
				trap->room = pRoomIndex;
				trap->type = flag_lookup(fread_word(fp), trap_table);
				trap->quality = fread_number(fp);

				if (trap->quality > 10)
					trap->quality = 10;

				trap->complexity = fread_number(fp);
				trap->timer = fread_number(fp);

				if (trap->timer < 0)
					trap->timer = 0;

				trap->trig_echo = fread_string(fp);
				trap->exec_echo = fread_string(fp);
				trap->armed = true;
				pRoomIndex->trap = trap;
			}
			else if (letter == 'O')
			{
				fread_word(fp);

				if (pRoomIndex->owner[0] != '\0')
					bugout("Load_rooms: duplicate owner.");

				pRoomIndex->owner = fread_string(fp);
			}
			else if (letter == 'R')
			{
				fread_word(fp);
				bword = fread_word(fp);
				bitvect = flag_lookup(bword, room_flags);
				if (bitvect == NO_FLAG && str_cmp(bword, "dark"))
					bugout("Invalid bitvector specified for room flags.");
				SET_BIT(pRoomIndex->room_flags, bitvect);
			}
			else
			{
				ungetc(letter, fp);
				break;
			}
		}

		iHash = vnum % MAX_KEY_HASH;
		pRoomIndex->next = room_index_hash[iHash];
		room_index_hash[iHash] = pRoomIndex;
		pRoomIndex->next_room = room_list;
		room_list = pRoomIndex;
		top_room++;
	}
}